

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O3

void __thiscall
t_ocaml_generator::generate_ocaml_method_copy
          (t_ocaml_generator *this,ostream *out,
          vector<t_field_*,_std::allocator<t_field_*>_> *members)

{
  int *piVar1;
  ostream *poVar2;
  pointer pptVar3;
  
  poVar2 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"method copy =",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 2;
  poVar2 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"let _new = Oo.copy self in",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  for (pptVar3 = (members->super__Vector_base<t_field_*,_std::allocator<t_field_*>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      pptVar3 !=
      (members->super__Vector_base<t_field_*,_std::allocator<t_field_*>_>)._M_impl.
      super__Vector_impl_data._M_finish; pptVar3 = pptVar3 + 1) {
    generate_ocaml_member_copy(this,out,*pptVar3);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar2 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"_new",4);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  return;
}

Assistant:

void t_ocaml_generator::generate_ocaml_method_copy(ostream& out, const vector<t_field*>& members) {
  vector<t_field*>::const_iterator m_iter;

  /* Create a copy of the current object */
  indent(out) << "method copy =" << endl;
  indent_up();
  indent_up();
  indent(out) << "let _new = Oo.copy self in" << endl;
  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter)
    generate_ocaml_member_copy(out, *m_iter);

  indent_down();
  indent(out) << "_new" << endl;
  indent_down();
}